

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O0

TValue * cpparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  TValue *pTVar1;
  int iVar2;
  char *pcVar3;
  GCstr *pGVar4;
  GCfunc *pGVar5;
  int __c;
  GCproto *local_128;
  int bc;
  GCfunc *fn;
  GCproto *pt;
  LexState *ls;
  void *ud_local;
  lua_CFunction dummy_local;
  lua_State *L_local;
  
  *(undefined4 *)((long)L->cframe + 0xc) = 0xffffffff;
  iVar2 = lj_lex_setup(L,(LexState *)ud);
  if (*(long *)((long)ud + 0x88) != 0) {
    __c = 0x74;
    if (iVar2 != 0) {
      __c = 0x62;
    }
    pcVar3 = strchr(*(char **)((long)ud + 0x88),__c);
    if (pcVar3 == (char *)0x0) {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pGVar4 = lj_err_str(L,LJ_ERR_XMODE);
      pTVar1->u64 = (ulong)pGVar4 | 0xfffd800000000000;
      lj_err_throw(L,3);
    }
  }
  if (iVar2 == 0) {
    local_128 = lj_parse((LexState *)ud);
  }
  else {
    local_128 = lj_bcread((LexState *)ud);
  }
  pGVar5 = lj_func_newL_empty(L,local_128,(GCtab *)(L->env).gcptr64);
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->u64 = (ulong)pGVar5 | 0xfffb800000000000;
  return (TValue *)0x0;
}

Assistant:

static TValue *cpparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  LexState *ls = (LexState *)ud;
  GCproto *pt;
  GCfunc *fn;
  int bc;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  bc = lj_lex_setup(L, ls);
  if (ls->mode && !strchr(ls->mode, bc ? 'b' : 't')) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_XMODE));
    lj_err_throw(L, LUA_ERRSYNTAX);
  }
  pt = bc ? lj_bcread(ls) : lj_parse(ls);
  fn = lj_func_newL_empty(L, pt, tabref(L->env));
  /* Don't combine above/below into one statement. */
  setfuncV(L, L->top++, fn);
  return NULL;
}